

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

bool AM_clipMline(mline_t *ml,fline_t *fl)

{
  int iVar1;
  fpoint_t fVar2;
  fpoint_t fVar3;
  uint uVar4;
  int32_t iVar5;
  double dVar6;
  double dVar7;
  int dy;
  int dx;
  fpoint_t tmp;
  int outside;
  int outcode2;
  int outcode1;
  fline_t *fl_local;
  mline_t *ml_local;
  
  outside = 0;
  tmp.y = 0;
  memset(&dy,0,8);
  if ((ml->a).y <= m_y2) {
    if ((ml->a).y < m_y) {
      outside = 4;
    }
  }
  else {
    outside = 8;
  }
  if ((ml->b).y <= m_y2) {
    if ((ml->b).y < m_y) {
      tmp.y = 4;
    }
  }
  else {
    tmp.y = 8;
  }
  if ((outside & tmp.y) == 0) {
    if (m_x <= (ml->a).x) {
      if (m_x2 < (ml->a).x) {
        outside = outside | 2;
      }
    }
    else {
      outside = outside | 1;
    }
    if (m_x <= (ml->b).x) {
      if (m_x2 < (ml->b).x) {
        tmp.y = tmp.y | 2;
      }
    }
    else {
      tmp.y = tmp.y | 1;
    }
    if ((outside & tmp.y) == 0) {
      dVar6 = MTOF((ml->a).x - m_x);
      (fl->a).x = (int)dVar6;
      dVar6 = (double)f_h;
      dVar7 = MTOF((ml->a).y - m_y);
      (fl->a).y = (int)(dVar6 - dVar7);
      dVar6 = MTOF((ml->b).x - m_x);
      (fl->b).x = (int)dVar6;
      dVar6 = (double)f_h;
      dVar7 = MTOF((ml->b).y - m_y);
      (fl->b).y = (int)(dVar6 - dVar7);
      outside = 0;
      if ((fl->a).y < 0) {
        outside = 8;
      }
      else if (f_h <= (fl->a).y) {
        outside = 4;
      }
      if ((fl->a).x < 0) {
        outside = outside | 1;
      }
      else if (f_w <= (fl->a).x) {
        outside = outside | 2;
      }
      tmp.y = 0;
      if ((fl->b).y < 0) {
        tmp.y = 8;
      }
      else if (f_h <= (fl->b).y) {
        tmp.y = 4;
      }
      if ((fl->b).x < 0) {
        tmp.y = tmp.y | 1;
      }
      else if (f_w <= (fl->b).x) {
        tmp.y = tmp.y | 2;
      }
      uVar4 = outside & tmp.y;
      while (uVar4 == 0) {
        if (outside == 0 && tmp.y == 0) {
          return true;
        }
        tmp.x = tmp.y;
        if (outside != 0) {
          tmp.x = outside;
        }
        if ((tmp.x & 8U) == 0) {
          if ((tmp.x & 4U) == 0) {
            if ((tmp.x & 2U) == 0) {
              if ((tmp.x & 1U) != 0) {
                iVar1 = (fl->a).y;
                iVar5 = Scale((fl->b).y - (fl->a).y,-(fl->a).x,(fl->b).x - (fl->a).x);
                dx = iVar1 + iVar5;
                dy = 0;
              }
            }
            else {
              iVar1 = (fl->a).y;
              iVar5 = Scale((fl->b).y - (fl->a).y,(f_w + -1) - (fl->a).x,(fl->b).x - (fl->a).x);
              dx = iVar1 + iVar5;
              dy = f_w + -1;
            }
          }
          else {
            iVar1 = (fl->a).x;
            iVar5 = Scale((fl->b).x - (fl->a).x,(fl->a).y - f_h,(fl->a).y - (fl->b).y);
            dy = iVar1 + iVar5;
            dx = f_h + -1;
          }
        }
        else {
          iVar1 = (fl->a).x;
          iVar5 = Scale((fl->b).x - (fl->a).x,(fl->a).y,(fl->a).y - (fl->b).y);
          dy = iVar1 + iVar5;
          dx = 0;
        }
        if (tmp.x == outside) {
          fVar2.y = dx;
          fVar2.x = dy;
          fl->a = fVar2;
          outside = 0;
          if ((fl->a).y < 0) {
            outside = 8;
          }
          else if (f_h <= (fl->a).y) {
            outside = 4;
          }
          if ((fl->a).x < 0) {
            outside = outside | 1;
          }
          else if (f_w <= (fl->a).x) {
            outside = outside | 2;
          }
        }
        else {
          fVar3.y = dx;
          fVar3.x = dy;
          fl->b = fVar3;
          tmp.y = 0;
          if ((fl->b).y < 0) {
            tmp.y = 8;
          }
          else if (f_h <= (fl->b).y) {
            tmp.y = 4;
          }
          if ((fl->b).x < 0) {
            tmp.y = tmp.y | 1;
          }
          else if (f_w <= (fl->b).x) {
            tmp.y = tmp.y | 2;
          }
        }
        uVar4 = outside & tmp.y;
      }
    }
  }
  return false;
}

Assistant:

bool AM_clipMline (mline_t *ml, fline_t *fl)
{
	enum {
		LEFT	=1,
		RIGHT	=2,
		BOTTOM	=4,
		TOP		=8
	};

	int outcode1 = 0;
	int outcode2 = 0;
	int outside;

	fpoint_t tmp = { 0, 0 };
	int dx;
	int dy;

#define DOOUTCODE(oc, mx, my) \
	(oc) = 0; \
	if ((my) < 0) (oc) |= TOP; \
	else if ((my) >= f_h) (oc) |= BOTTOM; \
	if ((mx) < 0) (oc) |= LEFT; \
	else if ((mx) >= f_w) (oc) |= RIGHT;

	// do trivial rejects and outcodes
	if (ml->a.y > m_y2)
		outcode1 = TOP;
	else if (ml->a.y < m_y)
		outcode1 = BOTTOM;

	if (ml->b.y > m_y2)
		outcode2 = TOP;
	else if (ml->b.y < m_y)
		outcode2 = BOTTOM;

	if (outcode1 & outcode2)
		return false; // trivially outside

	if (ml->a.x < m_x)
		outcode1 |= LEFT;
	else if (ml->a.x > m_x2)
		outcode1 |= RIGHT;

	if (ml->b.x < m_x)
		outcode2 |= LEFT;
	else if (ml->b.x > m_x2)
		outcode2 |= RIGHT;

	if (outcode1 & outcode2)
		return false; // trivially outside

	// transform to frame-buffer coordinates.
	fl->a.x = CXMTOF(ml->a.x);
	fl->a.y = CYMTOF(ml->a.y);
	fl->b.x = CXMTOF(ml->b.x);
	fl->b.y = CYMTOF(ml->b.y);

	DOOUTCODE(outcode1, fl->a.x, fl->a.y);
	DOOUTCODE(outcode2, fl->b.x, fl->b.y);

	if (outcode1 & outcode2)
		return false;

	while (outcode1 | outcode2) {
		// may be partially inside box
		// find an outside point
		if (outcode1)
			outside = outcode1;
		else
			outside = outcode2;
	
		// clip to each side
		if (outside & TOP)
		{
			dy = fl->a.y - fl->b.y;
			dx = fl->b.x - fl->a.x;
			tmp.x = fl->a.x + Scale(dx, fl->a.y, dy);
			tmp.y = 0;
		}
		else if (outside & BOTTOM)
		{
			dy = fl->a.y - fl->b.y;
			dx = fl->b.x - fl->a.x;
			tmp.x = fl->a.x + Scale(dx, fl->a.y - f_h, dy);
			tmp.y = f_h-1;
		}
		else if (outside & RIGHT)
		{
			dy = fl->b.y - fl->a.y;
			dx = fl->b.x - fl->a.x;
			tmp.y = fl->a.y + Scale(dy, f_w-1 - fl->a.x, dx);
			tmp.x = f_w-1;
		}
		else if (outside & LEFT)
		{
			dy = fl->b.y - fl->a.y;
			dx = fl->b.x - fl->a.x;
			tmp.y = fl->a.y + Scale(dy, -fl->a.x, dx);
			tmp.x = 0;
		}

		if (outside == outcode1)
		{
			fl->a = tmp;
			DOOUTCODE(outcode1, fl->a.x, fl->a.y);
		}
		else
		{
			fl->b = tmp;
			DOOUTCODE(outcode2, fl->b.x, fl->b.y);
		}
	
		if (outcode1 & outcode2)
			return false; // trivially outside
	}

	return true;
}